

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_spacing(nk_context *ctx,int cols)

{
  nk_window *win_00;
  int iVar1;
  int iVar2;
  int rows;
  int index;
  int i;
  nk_rect none;
  nk_panel *layout;
  nk_window *win;
  int cols_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4a35,"void nk_spacing(struct nk_context *, int)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4a36,"void nk_spacing(struct nk_context *, int)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,18999,"void nk_spacing(struct nk_context *, int)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    win_00 = ctx->current;
    none._8_8_ = win_00->layout;
    iVar2 = ((((nk_panel *)none._8_8_)->row).index + cols) % (((nk_panel *)none._8_8_)->row).columns
    ;
    iVar1 = ((((nk_panel *)none._8_8_)->row).index + cols) / (((nk_panel *)none._8_8_)->row).columns
    ;
    win._4_4_ = cols;
    if (iVar1 != 0) {
      for (rows = 0; win._4_4_ = iVar2, rows < iVar1; rows = rows + 1) {
        nk_panel_alloc_row(ctx,win_00);
      }
    }
    if ((*(int *)(none._8_8_ + 0x70) != 0) && (*(int *)(none._8_8_ + 0x70) != 4)) {
      for (rows = 0; rows < win._4_4_; rows = rows + 1) {
        nk_panel_alloc_space((nk_rect *)&index,ctx);
      }
    }
    *(int *)(none._8_8_ + 0x74) = iVar2;
  }
  return;
}

Assistant:

NK_API void
nk_spacing(struct nk_context *ctx, int cols)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_rect none;
    int i, index, rows;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* spacing over row boundaries */
    win = ctx->current;
    layout = win->layout;
    index = (layout->row.index + cols) % layout->row.columns;
    rows = (layout->row.index + cols) / layout->row.columns;
    if (rows) {
        for (i = 0; i < rows; ++i)
            nk_panel_alloc_row(ctx, win);
        cols = index;
    }
    /* non table layout need to allocate space */
    if (layout->row.type != NK_LAYOUT_DYNAMIC_FIXED &&
        layout->row.type != NK_LAYOUT_STATIC_FIXED) {
        for (i = 0; i < cols; ++i)
            nk_panel_alloc_space(&none, ctx);
    } layout->row.index = index;
}